

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O2

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::CloneMap
          (SerializationCloner<Js::StreamWriter> *this,Src src,Dst dst)

{
  bool bVar1;
  uint32 data;
  JavascriptMap *this_00;
  Engine *pEVar2;
  Iterator iter;
  
  this_00 = VarTo<Js::JavascriptMap>(src);
  data = JavascriptMap::Size(this_00);
  Write(this,data);
  JavascriptMap::GetIterator((JavascriptMap *)&stack0xffffffffffffffb8);
  while( true ) {
    bVar1 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
            ::Iterator::Next((Iterator *)&stack0xffffffffffffffb8);
    if (!bVar1) break;
    pEVar2 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
             ::GetEngine(&this->
                          super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                        );
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Key
              ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
               &iter.current);
    SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
              (pEVar2,iter.current.ptr);
    pEVar2 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
             ::GetEngine(&this->
                          super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                        );
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Value
              ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
               &iter.current);
    SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
              (pEVar2,iter.current.ptr);
  }
  return;
}

Assistant:

void SerializationCloner<Writer>::CloneMap(Src src, Dst dst)
    {
        JavascriptMap* map = VarTo<JavascriptMap>(src);

        Write((int32)(map->Size()));

        JavascriptMap::MapDataList::Iterator iter = map->GetIterator();
        while (iter.Next())
        {
            const JavascriptMap::MapDataKeyValuePair& entry = iter.Current();
            this->GetEngine()->Clone(entry.Key());
            this->GetEngine()->Clone(entry.Value());
        }
    }